

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O0

FT_Error BDF_Size_Request(FT_Size size,FT_Size_Request req)

{
  long lVar1;
  long lVar2;
  long local_50;
  FT_Long height;
  FT_Error error;
  bdf_font_t *bdffont;
  FT_Bitmap_Size *bsize;
  FT_Face face;
  FT_Size_Request req_local;
  FT_Size size_local;
  
  lVar1 = size->face[1].face_flags;
  height._4_4_ = 0x17;
  if (req->vertResolution == 0) {
    local_50 = req->height;
  }
  else {
    local_50 = (long)(req->height * (ulong)req->vertResolution + 0x24) / 0x48;
  }
  lVar2 = local_50 + 0x20 >> 6;
  if (req->type == FT_SIZE_REQUEST_TYPE_NOMINAL) {
    if (lVar2 == size->face->available_sizes->y_ppem + 0x20 >> 6) {
      height._4_4_ = 0;
    }
  }
  else if (req->type == FT_SIZE_REQUEST_TYPE_REAL_DIM) {
    if (lVar2 == *(long *)(lVar1 + 0x40) + *(long *)(lVar1 + 0x48)) {
      height._4_4_ = 0;
    }
  }
  else {
    height._4_4_ = 7;
  }
  if (height._4_4_ == 0) {
    size_local._4_4_ = BDF_Size_Select(size,0);
  }
  else {
    size_local._4_4_ = height._4_4_;
  }
  return size_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Size_Request( FT_Size          size,
                    FT_Size_Request  req )
  {
    FT_Face          face    = size->face;
    FT_Bitmap_Size*  bsize   = face->available_sizes;
    bdf_font_t*      bdffont = ( (BDF_Face)face )->bdffont;
    FT_Error         error   = FT_ERR( Invalid_Pixel_Size );
    FT_Long          height;


    height = FT_REQUEST_HEIGHT( req );
    height = ( height + 32 ) >> 6;

    switch ( req->type )
    {
    case FT_SIZE_REQUEST_TYPE_NOMINAL:
      if ( height == ( ( bsize->y_ppem + 32 ) >> 6 ) )
        error = FT_Err_Ok;
      break;

    case FT_SIZE_REQUEST_TYPE_REAL_DIM:
      if ( height == ( bdffont->font_ascent +
                       bdffont->font_descent ) )
        error = FT_Err_Ok;
      break;

    default:
      error = FT_THROW( Unimplemented_Feature );
      break;
    }

    if ( error )
      return error;
    else
      return BDF_Size_Select( size, 0 );
  }